

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O0

void __thiscall BarrierTest_Wait_Test::TestBody(BarrierTest_Wait_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  AssertHelper local_180;
  Message local_178 [6];
  exception *e_1;
  TrueWithString gtest_msg_1;
  uint local_11c;
  undefined1 local_118 [4];
  arrival_token token;
  AssertHelper local_f8;
  Message local_f0 [6];
  exception *e;
  uint local_b8 [4];
  undefined1 auStack_a8 [8];
  TrueWithString gtest_msg;
  undefined1 local_80 [8];
  barrier<yamc::detail::default_barrier_completion> barrier;
  BarrierTest_Wait_Test *this_local;
  
  barrier.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)this;
  yamc::barrier<yamc::detail::default_barrier_completion>::barrier
            ((barrier<yamc::detail::default_barrier_completion> *)local_80,1);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_a8 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_a8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_a8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_b8[0] = (uint)yamc::barrier<yamc::detail::default_barrier_completion>::arrive
                                    ((barrier<yamc::detail::default_barrier_completion> *)local_80,1
                                    );
      yamc::barrier<yamc::detail::default_barrier_completion>::wait
                ((barrier<yamc::detail::default_barrier_completion> *)local_80,local_b8);
    }
  }
  else {
    testing::Message::Message(local_f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   "Expected: barrier.wait(barrier.arrive()) doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_a8)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)local_118);
    testing::Message::~Message(local_f0);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_a8);
  local_11c = (uint)yamc::barrier<yamc::detail::default_barrier_completion>::arrive
                              ((barrier<yamc::detail::default_barrier_completion> *)local_80,1);
  gtest_msg_1.value._M_string_length = 0;
  gtest_msg_1.value.field_2._M_allocated_capacity = 0;
  e_1 = (exception *)0x0;
  gtest_msg_1.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_1.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&e_1);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)&e_1);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::barrier<yamc::detail::default_barrier_completion>::wait
                ((barrier<yamc::detail::default_barrier_completion> *)local_80,&local_11c);
    }
  }
  else {
    testing::Message::Message(local_178);
    std::operator+(&local_1a0,
                   "Expected: barrier.wait(std::move(token)) doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_1);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    testing::Message::~Message(local_178);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&e_1);
  yamc::barrier<yamc::detail::default_barrier_completion>::~barrier
            ((barrier<yamc::detail::default_barrier_completion> *)local_80);
  return;
}

Assistant:

TEST(BarrierTest, Wait)
{
  yamc::barrier<> barrier{1};
  EXPECT_NO_THROW(barrier.wait(barrier.arrive()));
  auto token = barrier.arrive();
  EXPECT_NO_THROW(barrier.wait(std::move(token)));
}